

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_go_down(command *cmd)

{
  loc grid;
  player_upkeep *ppVar1;
  player *p;
  _Bool _Var2;
  wchar_t level;
  command *cmd_00;
  
  level = dungeon_get_next_level(player,(int)player->depth,L'\x01');
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  cmd_00 = (command *)cave;
  _Var2 = square_isdownstairs(cave,grid);
  if (!_Var2) {
    do_cmd_navigate_down(cmd_00);
    return;
  }
  if (z_info->max_depth - 1 == (int)player->depth) {
    msg("The dungeon does not appear to extend deeper");
    return;
  }
  if ((player->opts).opt[0x20] == true) {
    level = dungeon_get_next_level(player,(int)player->max_depth,L'\x01');
    _Var2 = is_quest(player,level);
    if (_Var2) {
      _Var2 = get_check("Are you sure you want to descend? ");
      if (!_Var2) {
        return;
      }
    }
  }
  player->upkeep->energy_use = (uint)z_info->move_energy;
  msgt(0x1d,"You enter a maze of down staircases.");
  p = player;
  ppVar1 = player->upkeep;
  ppVar1->create_up_stair = true;
  ppVar1->create_down_stair = false;
  dungeon_change_level(p,level);
  return;
}

Assistant:

void do_cmd_go_down(struct command *cmd)
{
	int descend_to = dungeon_get_next_level(player, player->depth, 1);

	/* Verify stairs */
	if (!square_isdownstairs(cave, player->grid)) {
		do_cmd_navigate_down(cmd);
		return;
	}

	/* Paranoia, no descent from z_info->max_depth - 1 */
	if (player->depth == z_info->max_depth - 1) {
		msg("The dungeon does not appear to extend deeper");
		return;
	}

	/* Warn a force_descend player if they're going to a quest level */
	if (OPT(player, birth_force_descend)) {
		descend_to = dungeon_get_next_level(player,
			player->max_depth, 1);
		if (is_quest(player, descend_to) &&
			!get_check("Are you sure you want to descend? "))
			return;
	}

	/* Hack -- take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Success */
	msgt(MSG_STAIRS_DOWN, "You enter a maze of down staircases.");

	/* Create a way back */
	player->upkeep->create_up_stair = true;
	player->upkeep->create_down_stair = false;

	/* Change level */
	dungeon_change_level(player, descend_to);
}